

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O1

void convolve_2d_sr_ver_4tap_avx2
               (int16_t *im_block,int32_t w,int32_t h,InterpFilterParams *filter_params_y,
               int32_t subpel_y_q4,uint8_t *dst,int32_t dst_stride)

{
  undefined4 uVar1;
  uint uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  ulong uVar5;
  long lVar6;
  int32_t iVar7;
  long lVar8;
  undefined1 (*pauVar9) [32];
  int16_t *piVar10;
  int16_t *piVar11;
  undefined1 (*pauVar12) [32];
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [64];
  __m128i d0;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  __m128i d0_1;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  
  uVar5 = (ulong)((uint)filter_params_y->taps * (subpel_y_q4 & 0xfU));
  piVar10 = filter_params_y->filter_ptr;
  if (w == 2) {
    auVar26._8_8_ = 0;
    auVar26._0_8_ = *(ulong *)im_block;
    auVar21 = vpshufd_avx(auVar26,0x55);
    uVar2 = *(uint *)(im_block + 4);
    auVar21 = vpinsrd_avx(auVar21,*(undefined4 *)(im_block + 4),1);
    uVar1 = *(undefined4 *)(piVar10 + uVar5 + 2);
    auVar16._4_4_ = uVar1;
    auVar16._0_4_ = uVar1;
    auVar16._8_4_ = uVar1;
    auVar16._12_4_ = uVar1;
    uVar1 = *(undefined4 *)(piVar10 + uVar5 + 4);
    auVar20._4_4_ = uVar1;
    auVar20._0_4_ = uVar1;
    auVar20._8_4_ = uVar1;
    auVar20._12_4_ = uVar1;
    auVar21 = vpunpcklwd_avx(auVar26,auVar21);
    lVar8 = 0;
    auVar30._8_4_ = 0x400;
    auVar30._0_8_ = 0x40000000400;
    auVar30._12_4_ = 0x400;
    do {
      auVar34 = vpmaddwd_avx(auVar21,auVar16);
      auVar21 = vpinsrd_avx(ZEXT416(uVar2),*(undefined4 *)(im_block + lVar8 * 2 + 6),1);
      auVar34 = vpaddd_avx(auVar34,auVar30);
      uVar2 = *(uint *)(im_block + lVar8 * 2 + 8);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)(im_block + lVar8 * 2 + 6);
      auVar21 = vpunpcklwd_avx(auVar21,auVar27);
      auVar31 = vpmaddwd_avx(auVar21,auVar20);
      auVar34 = vpaddd_avx(auVar34,auVar31);
      auVar34 = vpsrad_avx(auVar34,0xb);
      auVar34 = vpackssdw_avx(auVar34,auVar34);
      auVar34 = vpackuswb_avx(auVar34,auVar34);
      vpextrw_avx(auVar34,0);
      vpextrw_avx(auVar34,1);
      lVar8 = lVar8 + 2;
    } while (h != (int)lVar8);
  }
  else {
    uVar1 = *(undefined4 *)(piVar10 + uVar5 + 2);
    auVar14._4_4_ = uVar1;
    auVar14._0_4_ = uVar1;
    auVar14._8_4_ = uVar1;
    auVar14._12_4_ = uVar1;
    auVar14._16_4_ = uVar1;
    auVar14._20_4_ = uVar1;
    auVar14._24_4_ = uVar1;
    auVar14._28_4_ = uVar1;
    uVar1 = *(undefined4 *)(piVar10 + uVar5 + 4);
    auVar17._4_4_ = uVar1;
    auVar17._0_4_ = uVar1;
    auVar17._8_4_ = uVar1;
    auVar17._12_4_ = uVar1;
    auVar17._16_4_ = uVar1;
    auVar17._20_4_ = uVar1;
    auVar17._24_4_ = uVar1;
    auVar17._28_4_ = uVar1;
    if (w == 4) {
      uVar5 = *(ulong *)(im_block + 8);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)(im_block + 4);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = *(ulong *)im_block;
      auVar28._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar34;
      auVar28._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar31;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uVar5;
      auVar39._0_16_ = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar31;
      auVar39._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar21;
      auVar28 = vpunpcklwd_avx2(auVar28,auVar39);
      lVar8 = 0;
      auVar36._8_4_ = 0x400;
      auVar36._0_8_ = 0x40000000400;
      auVar36._12_4_ = 0x400;
      auVar36._16_4_ = 0x400;
      auVar36._20_4_ = 0x400;
      auVar36._24_4_ = 0x400;
      auVar36._28_4_ = 0x400;
      do {
        auVar35._8_8_ = 0;
        auVar35._0_8_ = *(ulong *)(im_block + lVar8 * 4 + 0xc);
        auVar22._8_8_ = 0;
        auVar22._0_8_ = uVar5;
        auVar33._0_16_ = ZEXT116(0) * auVar35 + ZEXT116(1) * auVar22;
        auVar33._16_16_ = ZEXT116(1) * auVar35;
        uVar5 = *(ulong *)(im_block + lVar8 * 4 + 0x10);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = uVar5;
        auVar37._0_16_ = ZEXT116(0) * auVar23 + ZEXT116(1) * auVar35;
        auVar37._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar23;
        auVar39 = vpmaddwd_avx2(auVar28,auVar14);
        auVar28 = vpunpcklwd_avx2(auVar33,auVar37);
        auVar39 = vpaddd_avx2(auVar39,auVar36);
        auVar37 = vpmaddwd_avx2(auVar28,auVar17);
        auVar39 = vpaddd_avx2(auVar39,auVar37);
        auVar39 = vpsrad_avx2(auVar39,0xb);
        auVar39 = vpackssdw_avx2(auVar39,auVar39);
        auVar39 = vpackuswb_avx2(auVar39,auVar39);
        *(int *)dst = auVar39._0_4_;
        *(int *)(dst + dst_stride) = auVar39._16_4_;
        dst = dst + dst_stride * 2;
        lVar8 = lVar8 + 2;
      } while (h != (int)lVar8);
    }
    else if (w == 8) {
      auVar28 = *(undefined1 (*) [32])im_block;
      auVar36 = *(undefined1 (*) [32])(im_block + 8);
      if (subpel_y_q4 == 8) {
        pauVar9 = (undefined1 (*) [32])(im_block + 0x18);
        auVar40._8_4_ = 0x400;
        auVar40._0_8_ = 0x40000000400;
        auVar40._12_4_ = 0x400;
        auVar40._16_4_ = 0x400;
        auVar40._20_4_ = 0x400;
        auVar40._24_4_ = 0x400;
        auVar40._28_4_ = 0x400;
        do {
          auVar17 = *pauVar9;
          auVar39 = vpaddw_avx2(auVar17,auVar28);
          auVar28 = *(undefined1 (*) [32])(pauVar9[-1] + 0x10);
          auVar36 = vpaddw_avx2(auVar28,auVar36);
          auVar37 = vpunpcklwd_avx2(auVar39,auVar36);
          auVar39 = vpunpckhwd_avx2(auVar39,auVar36);
          auVar36 = vpmaddwd_avx2(auVar37,auVar14);
          auVar39 = vpmaddwd_avx2(auVar39,auVar14);
          auVar36 = vpaddd_avx2(auVar36,auVar40);
          auVar37 = vpsrad_avx2(auVar36,0xb);
          auVar36 = vpaddd_avx2(auVar39,auVar40);
          auVar36 = vpsrad_avx2(auVar36,0xb);
          auVar36 = vpackssdw_avx2(auVar37,auVar36);
          auVar36 = vpackuswb_avx2(auVar36,auVar14);
          *(long *)dst = auVar36._0_8_;
          *(long *)(dst + dst_stride) = auVar36._16_8_;
          dst = dst + dst_stride * 2;
          pauVar9 = pauVar9 + 1;
          h = h + -2;
          auVar36 = auVar17;
        } while (h != 0);
      }
      else {
        auVar39 = vpunpcklwd_avx2(auVar28,auVar36);
        auVar28 = vpunpckhwd_avx2(auVar28,auVar36);
        pauVar9 = (undefined1 (*) [32])(im_block + 0x18);
        auVar24._8_4_ = 0x400;
        auVar24._0_8_ = 0x40000000400;
        auVar24._12_4_ = 0x400;
        auVar24._16_4_ = 0x400;
        auVar24._20_4_ = 0x400;
        auVar24._24_4_ = 0x400;
        auVar24._28_4_ = 0x400;
        do {
          auVar36 = vpmaddwd_avx2(auVar39,auVar14);
          auVar39 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar9[-1] + 0x10),*pauVar9);
          auVar37 = vpmaddwd_avx2(auVar28,auVar14);
          auVar28 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar9[-1] + 0x10),*pauVar9);
          auVar33 = vpmaddwd_avx2(auVar39,auVar17);
          auVar40 = vpmaddwd_avx2(auVar28,auVar17);
          auVar36 = vpaddd_avx2(auVar36,auVar24);
          auVar36 = vpaddd_avx2(auVar36,auVar33);
          auVar33 = vpsrad_avx2(auVar36,0xb);
          auVar36 = vpaddd_avx2(auVar37,auVar24);
          auVar36 = vpaddd_avx2(auVar40,auVar36);
          auVar36 = vpsrad_avx2(auVar36,0xb);
          auVar36 = vpackssdw_avx2(auVar33,auVar36);
          auVar36 = vpackuswb_avx2(auVar36,auVar14);
          *(long *)dst = auVar36._0_8_;
          *(long *)(dst + dst_stride) = auVar36._16_8_;
          dst = dst + dst_stride * 2;
          pauVar9 = pauVar9 + 1;
          h = h + -2;
        } while (h != 0);
      }
    }
    else if (w == 0x10) {
      auVar28 = *(undefined1 (*) [32])im_block;
      auVar39 = *(undefined1 (*) [32])(im_block + 0x10);
      auVar36 = *(undefined1 (*) [32])(im_block + 0x20);
      auVar25 = ZEXT3264(auVar36);
      if (subpel_y_q4 == 8) {
        pauVar9 = (undefined1 (*) [32])(im_block + 0x40);
        auVar18._8_4_ = 0x400;
        auVar18._0_8_ = 0x40000000400;
        auVar18._12_4_ = 0x400;
        auVar18._16_4_ = 0x400;
        auVar18._20_4_ = 0x400;
        auVar18._24_4_ = 0x400;
        auVar18._28_4_ = 0x400;
        do {
          auVar17 = *pauVar9;
          auVar40 = auVar25._0_32_;
          auVar36 = vpaddw_avx2(auVar40,auVar39);
          auVar37 = vpaddw_avx2(auVar17,auVar39);
          auVar39 = pauVar9[-1];
          auVar28 = vpaddw_avx2(auVar39,auVar28);
          auVar33 = vpunpcklwd_avx2(auVar28,auVar36);
          auVar28 = vpunpckhwd_avx2(auVar28,auVar36);
          auVar36 = vpmaddwd_avx2(auVar33,auVar14);
          auVar33 = vpmaddwd_avx2(auVar28,auVar14);
          auVar28 = vpaddw_avx2(auVar39,auVar40);
          auVar24 = vpunpcklwd_avx2(auVar37,auVar28);
          auVar28 = vpunpckhwd_avx2(auVar37,auVar28);
          auVar37 = vpmaddwd_avx2(auVar24,auVar14);
          auVar24 = vpmaddwd_avx2(auVar28,auVar14);
          auVar28 = vpaddd_avx2(auVar36,auVar18);
          auVar36 = vpsrad_avx2(auVar28,0xb);
          auVar28 = vpaddd_avx2(auVar33,auVar18);
          auVar28 = vpsrad_avx2(auVar28,0xb);
          auVar28 = vpackssdw_avx2(auVar36,auVar28);
          auVar36 = vpaddd_avx2(auVar37,auVar18);
          auVar37 = vpsrad_avx2(auVar36,0xb);
          auVar36 = vpaddd_avx2(auVar24,auVar18);
          auVar36 = vpsrad_avx2(auVar36,0xb);
          auVar36 = vpackssdw_avx2(auVar37,auVar36);
          auVar28 = vpackuswb_avx2(auVar28,auVar36);
          auVar28 = vpermq_avx2(auVar28,0xd8);
          *(undefined1 (*) [16])dst = auVar28._0_16_;
          *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar28._16_16_;
          dst = *(undefined1 (*) [16])dst + dst_stride * 2;
          pauVar9 = pauVar9 + 2;
          auVar25 = ZEXT3264(auVar17);
          h = h + -2;
          auVar28 = auVar40;
        } while (h != 0);
      }
      else {
        auVar33 = vpunpcklwd_avx2(auVar28,auVar39);
        auVar37 = vpunpckhwd_avx2(auVar28,auVar39);
        auVar24 = vpunpcklwd_avx2(auVar39,auVar36);
        auVar28 = vpunpckhwd_avx2(auVar39,auVar36);
        pauVar9 = (undefined1 (*) [32])(im_block + 0x40);
        auVar29._8_4_ = 0x400;
        auVar29._0_8_ = 0x40000000400;
        auVar29._12_4_ = 0x400;
        auVar29._16_4_ = 0x400;
        auVar29._20_4_ = 0x400;
        auVar29._24_4_ = 0x400;
        auVar29._28_4_ = 0x400;
        do {
          auVar36 = pauVar9[-1];
          auVar40 = vpmaddwd_avx2(auVar33,auVar14);
          auVar33 = vpunpcklwd_avx2(auVar25._0_32_,auVar36);
          auVar41 = vpmaddwd_avx2(auVar37,auVar14);
          auVar37 = vpunpckhwd_avx2(auVar25._0_32_,auVar36);
          auVar39 = *pauVar9;
          auVar25 = ZEXT3264(auVar39);
          auVar18 = vpmaddwd_avx2(auVar24,auVar14);
          auVar24 = vpunpcklwd_avx2(auVar36,auVar39);
          auVar4 = vpmaddwd_avx2(auVar28,auVar14);
          auVar28 = vpunpckhwd_avx2(auVar36,auVar39);
          auVar39 = vpmaddwd_avx2(auVar33,auVar17);
          auVar15 = vpmaddwd_avx2(auVar37,auVar17);
          auVar19 = vpmaddwd_avx2(auVar24,auVar17);
          auVar32 = vpmaddwd_avx2(auVar28,auVar17);
          auVar36 = vpaddd_avx2(auVar40,auVar29);
          auVar36 = vpaddd_avx2(auVar36,auVar39);
          auVar39 = vpsrad_avx2(auVar36,0xb);
          auVar36 = vpaddd_avx2(auVar41,auVar29);
          auVar36 = vpaddd_avx2(auVar36,auVar15);
          auVar36 = vpsrad_avx2(auVar36,0xb);
          auVar36 = vpackssdw_avx2(auVar39,auVar36);
          auVar39 = vpaddd_avx2(auVar18,auVar29);
          auVar39 = vpaddd_avx2(auVar39,auVar19);
          auVar40 = vpsrad_avx2(auVar39,0xb);
          auVar39 = vpaddd_avx2(auVar4,auVar29);
          auVar39 = vpaddd_avx2(auVar32,auVar39);
          auVar39 = vpsrad_avx2(auVar39,0xb);
          auVar39 = vpackssdw_avx2(auVar40,auVar39);
          auVar36 = vpackuswb_avx2(auVar36,auVar39);
          auVar36 = vpermq_avx2(auVar36,0xd8);
          *(undefined1 (*) [16])dst = auVar36._0_16_;
          *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar36._16_16_;
          dst = *(undefined1 (*) [16])dst + dst_stride * 2;
          pauVar9 = pauVar9 + 2;
          h = h + -2;
        } while (h != 0);
      }
    }
    else {
      lVar8 = (long)w;
      piVar10 = im_block + lVar8 * 4 + 0x10;
      piVar11 = im_block + lVar8 * 3 + 0x10;
      lVar6 = 0;
      auVar41._8_4_ = 0x400;
      auVar41._0_8_ = 0x40000000400;
      auVar41._12_4_ = 0x400;
      auVar41._16_4_ = 0x400;
      auVar41._20_4_ = 0x400;
      auVar41._24_4_ = 0x400;
      auVar41._28_4_ = 0x400;
      do {
        pauVar9 = (undefined1 (*) [32])(im_block + lVar6);
        pauVar12 = (undefined1 (*) [32])(dst + lVar6);
        auVar39 = *(undefined1 (*) [32])(*pauVar9 + lVar8 * 4);
        auVar37 = *(undefined1 (*) [32])(pauVar9[1] + lVar8 * 4);
        auVar28 = *(undefined1 (*) [32])(*pauVar9 + lVar8 * 2);
        auVar36 = *(undefined1 (*) [32])(pauVar9[1] + lVar8 * 2);
        auVar40 = vpunpcklwd_avx2(*pauVar9,auVar28);
        auVar24 = vpunpckhwd_avx2(*pauVar9,auVar28);
        auVar18 = vpunpcklwd_avx2(auVar28,auVar39);
        auVar33 = vpunpckhwd_avx2(auVar28,auVar39);
        auVar4 = vpunpcklwd_avx2(pauVar9[1],auVar36);
        auVar28 = vpunpckhwd_avx2(pauVar9[1],auVar36);
        auVar29 = vpunpcklwd_avx2(auVar36,auVar37);
        auVar36 = vpunpckhwd_avx2(auVar36,auVar37);
        lVar13 = 0;
        iVar7 = h;
        do {
          auVar15 = *(undefined1 (*) [32])((long)piVar11 + lVar13 + -0x20);
          auVar19 = *(undefined1 (*) [32])((long)piVar11 + lVar13);
          auVar32 = vpmaddwd_avx2(auVar40,auVar14);
          auVar40 = vpunpcklwd_avx2(auVar39,auVar15);
          auVar38 = vpmaddwd_avx2(auVar24,auVar14);
          auVar24 = vpunpckhwd_avx2(auVar39,auVar15);
          auVar3 = vpmaddwd_avx2(auVar40,auVar17);
          auVar39 = vpaddd_avx2(auVar32,auVar41);
          auVar39 = vpaddd_avx2(auVar39,auVar3);
          auVar32 = vpmaddwd_avx2(auVar24,auVar17);
          auVar3 = vpmaddwd_avx2(auVar4,auVar14);
          auVar4 = vpaddd_avx2(auVar41,auVar38);
          auVar32 = vpaddd_avx2(auVar32,auVar4);
          auVar4 = vpunpcklwd_avx2(auVar37,auVar19);
          auVar38 = vpmaddwd_avx2(auVar28,auVar14);
          auVar28 = vpunpckhwd_avx2(auVar37,auVar19);
          auVar37 = vpsrad_avx2(auVar39,0xb);
          auVar39 = vpsrad_avx2(auVar32,0xb);
          auVar32 = vpackssdw_avx2(auVar37,auVar39);
          auVar37 = vpmaddwd_avx2(auVar4,auVar17);
          auVar39 = vpaddd_avx2(auVar41,auVar3);
          auVar37 = vpaddd_avx2(auVar39,auVar37);
          auVar3 = vpmaddwd_avx2(auVar28,auVar17);
          auVar39 = vpaddd_avx2(auVar38,auVar41);
          auVar38 = vpaddd_avx2(auVar39,auVar3);
          auVar39 = *(undefined1 (*) [32])((long)piVar10 + lVar13 + -0x20);
          auVar37 = vpsrad_avx2(auVar37,0xb);
          auVar38 = vpsrad_avx2(auVar38,0xb);
          auVar38 = vpackssdw_avx2(auVar37,auVar38);
          auVar37 = *(undefined1 (*) [32])((long)piVar10 + lVar13);
          auVar3 = vpmaddwd_avx2(auVar18,auVar14);
          auVar32 = vpackuswb_avx2(auVar32,auVar38);
          auVar18 = vpunpcklwd_avx2(auVar15,auVar39);
          auVar38 = vpmaddwd_avx2(auVar33,auVar14);
          auVar33 = vpunpckhwd_avx2(auVar15,auVar39);
          *pauVar12 = auVar32;
          auVar32 = vpmaddwd_avx2(auVar18,auVar17);
          auVar15 = vpaddd_avx2(auVar3,auVar41);
          auVar15 = vpaddd_avx2(auVar15,auVar32);
          auVar32 = vpmaddwd_avx2(auVar33,auVar17);
          auVar3 = vpmaddwd_avx2(auVar14,auVar29);
          auVar29 = vpaddd_avx2(auVar41,auVar38);
          auVar32 = vpaddd_avx2(auVar32,auVar29);
          auVar29 = vpunpcklwd_avx2(auVar19,auVar37);
          auVar38 = vpmaddwd_avx2(auVar14,auVar36);
          auVar36 = vpunpckhwd_avx2(auVar19,auVar37);
          auVar15 = vpsrad_avx2(auVar15,0xb);
          auVar19 = vpsrad_avx2(auVar32,0xb);
          auVar15 = vpackssdw_avx2(auVar15,auVar19);
          auVar32 = vpmaddwd_avx2(auVar29,auVar17);
          auVar19 = vpaddd_avx2(auVar41,auVar3);
          auVar19 = vpaddd_avx2(auVar19,auVar32);
          auVar3 = vpmaddwd_avx2(auVar36,auVar17);
          auVar32 = vpaddd_avx2(auVar41,auVar38);
          auVar32 = vpaddd_avx2(auVar32,auVar3);
          auVar19 = vpsrad_avx2(auVar19,0xb);
          auVar32 = vpsrad_avx2(auVar32,0xb);
          auVar19 = vpackssdw_avx2(auVar19,auVar32);
          auVar15 = vpackuswb_avx2(auVar15,auVar19);
          *(undefined1 (*) [32])(*pauVar12 + dst_stride) = auVar15;
          pauVar12 = (undefined1 (*) [32])(*pauVar12 + dst_stride * 2);
          lVar13 = lVar13 + (long)(w * 2) * 2;
          iVar7 = iVar7 + -2;
        } while (iVar7 != 0);
        lVar6 = lVar6 + 0x20;
        piVar10 = piVar10 + 0x20;
        piVar11 = piVar11 + 0x20;
      } while (lVar6 < lVar8);
    }
  }
  return;
}

Assistant:

static void convolve_2d_sr_ver_4tap_avx2(
    const int16_t *const im_block, const int32_t w, const int32_t h,
    const InterpFilterParams *const filter_params_y, const int32_t subpel_y_q4,
    uint8_t *dst, const int32_t dst_stride) {
  const int16_t *im = im_block;
  int32_t y = h;

  if (w == 2) {
    __m128i coeffs_128[2], s_32[4], ss_128[2];

    prepare_coeffs_4tap_sse2(filter_params_y, subpel_y_q4, coeffs_128);

    s_32[0] = _mm_cvtsi32_si128(*(int32_t *)(im + 0 * 2));
    s_32[1] = _mm_cvtsi32_si128(*(int32_t *)(im + 1 * 2));
    s_32[2] = _mm_cvtsi32_si128(*(int32_t *)(im + 2 * 2));

    const __m128i src01 = _mm_unpacklo_epi32(s_32[0], s_32[1]);
    const __m128i src12 = _mm_unpacklo_epi32(s_32[1], s_32[2]);

    ss_128[0] = _mm_unpacklo_epi16(src01, src12);

    do {
      const __m128i res =
          xy_y_convolve_4tap_2x2_sse2(im, s_32, ss_128, coeffs_128);
      xy_y_round_store_2x2_sse2(res, dst, dst_stride);
      im += 2 * 2;
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else {
    __m256i coeffs_256[2];

    prepare_coeffs_4tap_avx2(filter_params_y, subpel_y_q4, coeffs_256);

    if (w == 4) {
      __m128i s_64[4];
      __m256i s_256[2], ss_256[2];

      s_64[0] = _mm_loadl_epi64((__m128i *)(im + 0 * 4));
      s_64[1] = _mm_loadl_epi64((__m128i *)(im + 1 * 4));
      s_64[2] = _mm_loadl_epi64((__m128i *)(im + 2 * 4));

      // Load lines a and b. Line a to lower 128, line b to upper 128
      s_256[0] = _mm256_setr_m128i(s_64[0], s_64[1]);
      s_256[1] = _mm256_setr_m128i(s_64[1], s_64[2]);

      ss_256[0] = _mm256_unpacklo_epi16(s_256[0], s_256[1]);

      do {
        const __m256i res =
            xy_y_convolve_4tap_4x2_avx2(im, s_64, ss_256, coeffs_256);
        xy_y_round_store_4x2_avx2(res, dst, dst_stride);
        im += 2 * 4;
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    } else if (w == 8) {
      __m256i s_256[4], r[2];

      s_256[0] = _mm256_loadu_si256((__m256i *)(im + 0 * 8));
      s_256[1] = _mm256_loadu_si256((__m256i *)(im + 1 * 8));

      if (subpel_y_q4 != 8) {
        __m256i ss_256[4];

        ss_256[0] = _mm256_unpacklo_epi16(s_256[0], s_256[1]);
        ss_256[2] = _mm256_unpackhi_epi16(s_256[0], s_256[1]);

        do {
          xy_y_convolve_4tap_8x2_avx2(im, ss_256, coeffs_256, r);
          xy_y_round_store_8x2_avx2(r, dst, dst_stride);
          im += 2 * 8;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      } else {
        do {
          xy_y_convolve_4tap_8x2_half_pel_avx2(im, coeffs_256, s_256, r);
          xy_y_round_store_8x2_avx2(r, dst, dst_stride);
          im += 2 * 8;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      }
    } else if (w == 16) {
      __m256i s_256[5];

      s_256[0] = _mm256_loadu_si256((__m256i *)(im + 0 * 16));
      s_256[1] = _mm256_loadu_si256((__m256i *)(im + 1 * 16));
      s_256[2] = _mm256_loadu_si256((__m256i *)(im + 2 * 16));

      if (subpel_y_q4 != 8) {
        __m256i ss_256[4], tt_256[4], r[4];

        ss_256[0] = _mm256_unpacklo_epi16(s_256[0], s_256[1]);
        ss_256[2] = _mm256_unpackhi_epi16(s_256[0], s_256[1]);

        tt_256[0] = _mm256_unpacklo_epi16(s_256[1], s_256[2]);
        tt_256[2] = _mm256_unpackhi_epi16(s_256[1], s_256[2]);

        do {
          xy_y_convolve_4tap_16x2_avx2(im, s_256, ss_256, tt_256, coeffs_256,
                                       r);
          xy_y_round_store_16x2_avx2(r, dst, dst_stride);
          im += 2 * 16;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      } else {
        __m256i r[4];

        do {
          xy_y_convolve_4tap_16x2_half_pelavx2(im, s_256, coeffs_256, r);
          xy_y_round_store_16x2_avx2(r, dst, dst_stride);
          im += 2 * 16;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      }
    } else {
      /*It's a special condition for OBMC. A/c  to Av1 spec 4-tap won't
      support for width(w)>16, but for OBMC while predicting above block
      it reduces size block to Wx(h/2), for example, if above block size
      is 32x8, we get block size as 32x4 for OBMC.*/
      int32_t x = 0;

      assert(!(w % 32));

      __m256i s_256[2][4], ss_256[2][4], tt_256[2][4], r0[4], r1[4];
      do {
        const int16_t *s = im + x;
        uint8_t *d = dst + x;

        loadu_unpack_16bit_3rows_avx2(s, w, s_256[0], ss_256[0], tt_256[0]);
        loadu_unpack_16bit_3rows_avx2(s + 16, w, s_256[1], ss_256[1],
                                      tt_256[1]);

        y = h;
        do {
          xy_y_convolve_4tap_32x2_avx2(s, w, s_256[0], ss_256[0], tt_256[0],
                                       coeffs_256, r0);
          xy_y_convolve_4tap_32x2_avx2(s + 16, w, s_256[1], ss_256[1],
                                       tt_256[1], coeffs_256, r1);

          xy_y_round_store_32_avx2(r0 + 0, r1 + 0, d);
          xy_y_round_store_32_avx2(r0 + 2, r1 + 2, d + dst_stride);

          s += 2 * w;
          d += 2 * dst_stride;
          y -= 2;
        } while (y);

        x += 32;
      } while (x < w);
    }
  }
}